

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jidctint.c
# Opt level: O0

void jpeg_idct_16x8(j_decompress_ptr cinfo,jpeg_component_info *compptr,JCOEFPTR coef_block,
                   JSAMPARRAY output_buf,JDIMENSION output_col)

{
  JSAMPLE *pJVar1;
  int iVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  JSAMPROW pJVar14;
  long lVar15;
  long lVar16;
  long lVar17;
  long lVar18;
  long lVar19;
  long lVar20;
  long lVar21;
  long lVar22;
  long lVar23;
  long lVar24;
  long lVar25;
  long lVar26;
  JSAMPLE local_208 [4];
  int dcval;
  int workspace [64];
  int local_fc;
  int ctr;
  JSAMPLE *range_limit;
  JSAMPROW outptr;
  int *wsptr;
  ISLOW_MULT_TYPE *quantptr;
  JCOEFPTR inptr;
  INT32 z4;
  INT32 z3;
  INT32 z2;
  INT32 z1;
  INT32 tmp27;
  INT32 tmp26;
  INT32 tmp25;
  INT32 tmp24;
  INT32 tmp23;
  INT32 tmp22;
  INT32 tmp21;
  INT32 tmp20;
  INT32 tmp13;
  INT32 tmp12;
  INT32 tmp11;
  INT32 tmp10;
  INT32 tmp3;
  INT32 tmp2;
  INT32 tmp1;
  INT32 tmp0;
  JDIMENSION output_col_local;
  JSAMPARRAY output_buf_local;
  JCOEFPTR coef_block_local;
  jpeg_component_info *compptr_local;
  j_decompress_ptr cinfo_local;
  
  pJVar1 = cinfo->sample_range_limit;
  wsptr = (int *)compptr->dct_table;
  outptr = local_208;
  quantptr = (ISLOW_MULT_TYPE *)coef_block;
  for (local_fc = 8; 0 < local_fc; local_fc = local_fc + -1) {
    if (((((short)quantptr[4] == 0) && ((short)quantptr[8] == 0)) && ((short)quantptr[0xc] == 0)) &&
       ((((short)quantptr[0x10] == 0 && ((short)quantptr[0x14] == 0)) &&
        (((short)quantptr[0x18] == 0 && ((short)quantptr[0x1c] == 0)))))) {
      iVar2 = (int)(short)*quantptr * *wsptr * 4;
      *(int *)outptr = iVar2;
      *(int *)(outptr + 0x20) = iVar2;
      *(int *)(outptr + 0x40) = iVar2;
      *(int *)(outptr + 0x60) = iVar2;
      *(int *)(outptr + 0x80) = iVar2;
      *(int *)(outptr + 0xa0) = iVar2;
      *(int *)(outptr + 0xc0) = iVar2;
      *(int *)(outptr + 0xe0) = iVar2;
    }
    else {
      lVar3 = (long)((int)(short)quantptr[8] * wsptr[0x10]);
      lVar4 = (long)((int)(short)quantptr[0x18] * wsptr[0x30]);
      lVar5 = (lVar3 + lVar4) * 0x1151;
      lVar3 = lVar5 + lVar3 * 0x187e;
      lVar5 = lVar5 + lVar4 * -0x3b21;
      lVar4 = (long)((int)(short)quantptr[0x10] * wsptr[0x20]);
      lVar6 = (long)((int)(short)*quantptr * *wsptr) * 0x2000 + 0x400;
      lVar7 = lVar6 + lVar4 * 0x2000;
      lVar6 = lVar6 + lVar4 * -0x2000;
      lVar4 = lVar7 + lVar3;
      lVar7 = lVar7 - lVar3;
      lVar3 = lVar6 + lVar5;
      lVar6 = lVar6 - lVar5;
      lVar5 = (long)((int)(short)quantptr[0x1c] * wsptr[0x38]);
      lVar8 = (long)((int)(short)quantptr[0x14] * wsptr[0x28]);
      lVar9 = (long)((int)(short)quantptr[0xc] * wsptr[0x18]);
      lVar10 = (long)((int)(short)quantptr[4] * wsptr[8]);
      lVar11 = (lVar5 + lVar9 + lVar8 + lVar10) * 0x25a1;
      lVar12 = lVar11 + (lVar5 + lVar9) * -0x3ec5;
      lVar11 = lVar11 + (lVar8 + lVar10) * -0xc7c;
      lVar13 = (lVar5 + lVar10) * -0x1ccd;
      lVar5 = lVar13 + lVar12 + lVar5 * 0x98e;
      lVar10 = lVar13 + lVar11 + lVar10 * 0x300b;
      lVar13 = (lVar8 + lVar9) * -0x5203;
      lVar8 = lVar13 + lVar11 + lVar8 * 0x41b3;
      lVar9 = lVar13 + lVar12 + lVar9 * 0x6254;
      *(int *)outptr = (int)(lVar4 + lVar10 >> 0xb);
      *(int *)(outptr + 0xe0) = (int)(lVar4 - lVar10 >> 0xb);
      *(int *)(outptr + 0x20) = (int)(lVar3 + lVar9 >> 0xb);
      *(int *)(outptr + 0xc0) = (int)(lVar3 - lVar9 >> 0xb);
      *(int *)(outptr + 0x40) = (int)(lVar6 + lVar8 >> 0xb);
      *(int *)(outptr + 0xa0) = (int)(lVar6 - lVar8 >> 0xb);
      *(int *)(outptr + 0x60) = (int)(lVar7 + lVar5 >> 0xb);
      *(int *)(outptr + 0x80) = (int)(lVar7 - lVar5 >> 0xb);
    }
    quantptr = (ISLOW_MULT_TYPE *)((long)quantptr + 2);
    wsptr = wsptr + 1;
    outptr = outptr + 4;
  }
  outptr = local_208;
  for (local_fc = 0; local_fc < 8; local_fc = local_fc + 1) {
    pJVar14 = output_buf[local_fc] + output_col;
    lVar12 = ((long)*(int *)outptr + 0x10) * 0x2000;
    lVar3 = (long)*(int *)(outptr + 0x10);
    lVar9 = lVar12 + lVar3 * 0x29cf;
    lVar11 = lVar12 + lVar3 * -0x29cf;
    lVar10 = lVar12 + lVar3 * 0x1151;
    lVar12 = lVar12 + lVar3 * -0x1151;
    lVar3 = (long)*(int *)(outptr + 8);
    lVar4 = (long)*(int *)(outptr + 0x18);
    lVar8 = (lVar3 - lVar4) * 0x8d4;
    lVar6 = (lVar3 - lVar4) * 0x2c63;
    lVar5 = lVar6 + lVar4 * 0x5203;
    lVar7 = lVar8 + lVar3 * 0x1ccd;
    lVar6 = lVar6 + lVar3 * -0x133e;
    lVar8 = lVar8 + lVar4 * -0x1050;
    lVar3 = lVar9 + lVar5;
    lVar9 = lVar9 - lVar5;
    lVar4 = lVar10 + lVar7;
    lVar10 = lVar10 - lVar7;
    lVar5 = lVar12 + lVar6;
    lVar12 = lVar12 - lVar6;
    lVar7 = lVar11 + lVar8;
    lVar11 = lVar11 - lVar8;
    lVar6 = (long)*(int *)(outptr + 4);
    lVar8 = (long)*(int *)(outptr + 0xc);
    lVar13 = (long)*(int *)(outptr + 0x14);
    lVar15 = (long)*(int *)(outptr + 0x1c);
    lVar16 = (lVar6 + lVar8) * 0x2b4e;
    lVar17 = (lVar6 + lVar13) * 0x27e9;
    lVar18 = (lVar6 + lVar15) * 0x22fc;
    lVar19 = (lVar6 - lVar15) * 0x1cb6;
    lVar20 = (lVar6 + lVar13) * 0x1555;
    lVar21 = (lVar6 - lVar8) * 0xd23;
    lVar22 = lVar16 + lVar17 + lVar18 + lVar6 * -0x492a;
    lVar6 = lVar19 + lVar20 + lVar21 + lVar6 * -0x3abe;
    lVar23 = (lVar8 + lVar13) * 0x470;
    lVar24 = (lVar13 - lVar8) * 0x2d09;
    lVar25 = (lVar15 + lVar8) * -0x1555;
    lVar16 = lVar25 + lVar23 + lVar8 * 0x24d + lVar16;
    lVar26 = (lVar15 + lVar8) * -0x27e9;
    lVar8 = lVar26 + lVar24 + lVar8 * 0x3f1a + lVar21;
    lVar21 = (lVar13 + lVar15) * -0x2b4e;
    lVar17 = lVar21 + lVar23 + lVar13 * -0x2406 + lVar17;
    lVar21 = lVar21 + lVar25 + lVar15 * 0x2218 + lVar18;
    lVar18 = (lVar15 - lVar13) * 0xd23;
    lVar15 = lVar18 + lVar26 + lVar15 * 0x6485 + lVar19;
    lVar18 = lVar18 + lVar24 + lVar13 * -0x1886 + lVar20;
    *pJVar14 = pJVar1[(long)(int)((uint)(lVar3 + lVar22 >> 0x12) & 0x3ff) + 0x80];
    pJVar14[0xf] = pJVar1[(long)(int)((uint)(lVar3 - lVar22 >> 0x12) & 0x3ff) + 0x80];
    pJVar14[1] = pJVar1[(long)(int)((uint)(lVar4 + lVar16 >> 0x12) & 0x3ff) + 0x80];
    pJVar14[0xe] = pJVar1[(long)(int)((uint)(lVar4 - lVar16 >> 0x12) & 0x3ff) + 0x80];
    pJVar14[2] = pJVar1[(long)(int)((uint)(lVar5 + lVar17 >> 0x12) & 0x3ff) + 0x80];
    pJVar14[0xd] = pJVar1[(long)(int)((uint)(lVar5 - lVar17 >> 0x12) & 0x3ff) + 0x80];
    pJVar14[3] = pJVar1[(long)(int)((uint)(lVar7 + lVar21 >> 0x12) & 0x3ff) + 0x80];
    pJVar14[0xc] = pJVar1[(long)(int)((uint)(lVar7 - lVar21 >> 0x12) & 0x3ff) + 0x80];
    pJVar14[4] = pJVar1[(long)(int)((uint)(lVar11 + lVar15 >> 0x12) & 0x3ff) + 0x80];
    pJVar14[0xb] = pJVar1[(long)(int)((uint)(lVar11 - lVar15 >> 0x12) & 0x3ff) + 0x80];
    pJVar14[5] = pJVar1[(long)(int)((uint)(lVar12 + lVar18 >> 0x12) & 0x3ff) + 0x80];
    pJVar14[10] = pJVar1[(long)(int)((uint)(lVar12 - lVar18 >> 0x12) & 0x3ff) + 0x80];
    pJVar14[6] = pJVar1[(long)(int)((uint)(lVar10 + lVar8 >> 0x12) & 0x3ff) + 0x80];
    pJVar14[9] = pJVar1[(long)(int)((uint)(lVar10 - lVar8 >> 0x12) & 0x3ff) + 0x80];
    pJVar14[7] = pJVar1[(long)(int)((uint)(lVar9 + lVar6 >> 0x12) & 0x3ff) + 0x80];
    pJVar14[8] = pJVar1[(long)(int)((uint)(lVar9 - lVar6 >> 0x12) & 0x3ff) + 0x80];
    outptr = outptr + 0x20;
  }
  return;
}

Assistant:

GLOBAL(void)
jpeg_idct_16x8 (j_decompress_ptr cinfo, jpeg_component_info * compptr,
		JCOEFPTR coef_block,
		JSAMPARRAY output_buf, JDIMENSION output_col)
{
  INT32 tmp0, tmp1, tmp2, tmp3, tmp10, tmp11, tmp12, tmp13;
  INT32 tmp20, tmp21, tmp22, tmp23, tmp24, tmp25, tmp26, tmp27;
  INT32 z1, z2, z3, z4;
  JCOEFPTR inptr;
  ISLOW_MULT_TYPE * quantptr;
  int * wsptr;
  JSAMPROW outptr;
  JSAMPLE *range_limit = IDCT_range_limit(cinfo);
  int ctr;
  int workspace[8*8];	/* buffers data between passes */
  SHIFT_TEMPS

  /* Pass 1: process columns from input, store into work array. */
  /* Note results are scaled up by sqrt(8) compared to a true IDCT; */
  /* furthermore, we scale the results by 2**PASS1_BITS. */

  inptr = coef_block;
  quantptr = (ISLOW_MULT_TYPE *) compptr->dct_table;
  wsptr = workspace;
  for (ctr = DCTSIZE; ctr > 0; ctr--) {
    /* Due to quantization, we will usually find that many of the input
     * coefficients are zero, especially the AC terms.  We can exploit this
     * by short-circuiting the IDCT calculation for any column in which all
     * the AC terms are zero.  In that case each output is equal to the
     * DC coefficient (with scale factor as needed).
     * With typical images and quantization tables, half or more of the
     * column DCT calculations can be simplified this way.
     */
    
    if (inptr[DCTSIZE*1] == 0 && inptr[DCTSIZE*2] == 0 &&
	inptr[DCTSIZE*3] == 0 && inptr[DCTSIZE*4] == 0 &&
	inptr[DCTSIZE*5] == 0 && inptr[DCTSIZE*6] == 0 &&
	inptr[DCTSIZE*7] == 0) {
      /* AC terms all zero */
      int dcval = DEQUANTIZE(inptr[DCTSIZE*0], quantptr[DCTSIZE*0]) << PASS1_BITS;
      
      wsptr[DCTSIZE*0] = dcval;
      wsptr[DCTSIZE*1] = dcval;
      wsptr[DCTSIZE*2] = dcval;
      wsptr[DCTSIZE*3] = dcval;
      wsptr[DCTSIZE*4] = dcval;
      wsptr[DCTSIZE*5] = dcval;
      wsptr[DCTSIZE*6] = dcval;
      wsptr[DCTSIZE*7] = dcval;
      
      inptr++;			/* advance pointers to next column */
      quantptr++;
      wsptr++;
      continue;
    }
    
    /* Even part: reverse the even part of the forward DCT. */
    /* The rotator is sqrt(2)*c(-6). */
    
    z2 = DEQUANTIZE(inptr[DCTSIZE*2], quantptr[DCTSIZE*2]);
    z3 = DEQUANTIZE(inptr[DCTSIZE*6], quantptr[DCTSIZE*6]);
    
    z1 = MULTIPLY(z2 + z3, FIX_0_541196100);
    tmp2 = z1 + MULTIPLY(z2, FIX_0_765366865);
    tmp3 = z1 - MULTIPLY(z3, FIX_1_847759065);
    
    z2 = DEQUANTIZE(inptr[DCTSIZE*0], quantptr[DCTSIZE*0]);
    z3 = DEQUANTIZE(inptr[DCTSIZE*4], quantptr[DCTSIZE*4]);
    z2 <<= CONST_BITS;
    z3 <<= CONST_BITS;
    /* Add fudge factor here for final descale. */
    z2 += ONE << (CONST_BITS-PASS1_BITS-1);

    tmp0 = z2 + z3;
    tmp1 = z2 - z3;
    
    tmp10 = tmp0 + tmp2;
    tmp13 = tmp0 - tmp2;
    tmp11 = tmp1 + tmp3;
    tmp12 = tmp1 - tmp3;
    
    /* Odd part per figure 8; the matrix is unitary and hence its
     * transpose is its inverse.  i0..i3 are y7,y5,y3,y1 respectively.
     */
    
    tmp0 = DEQUANTIZE(inptr[DCTSIZE*7], quantptr[DCTSIZE*7]);
    tmp1 = DEQUANTIZE(inptr[DCTSIZE*5], quantptr[DCTSIZE*5]);
    tmp2 = DEQUANTIZE(inptr[DCTSIZE*3], quantptr[DCTSIZE*3]);
    tmp3 = DEQUANTIZE(inptr[DCTSIZE*1], quantptr[DCTSIZE*1]);
    
    z2 = tmp0 + tmp2;
    z3 = tmp1 + tmp3;

    z1 = MULTIPLY(z2 + z3, FIX_1_175875602); /* sqrt(2) * c3 */
    z2 = MULTIPLY(z2, - FIX_1_961570560); /* sqrt(2) * (-c3-c5) */
    z3 = MULTIPLY(z3, - FIX_0_390180644); /* sqrt(2) * (c5-c3) */
    z2 += z1;
    z3 += z1;

    z1 = MULTIPLY(tmp0 + tmp3, - FIX_0_899976223); /* sqrt(2) * (c7-c3) */
    tmp0 = MULTIPLY(tmp0, FIX_0_298631336); /* sqrt(2) * (-c1+c3+c5-c7) */
    tmp3 = MULTIPLY(tmp3, FIX_1_501321110); /* sqrt(2) * ( c1+c3-c5-c7) */
    tmp0 += z1 + z2;
    tmp3 += z1 + z3;

    z1 = MULTIPLY(tmp1 + tmp2, - FIX_2_562915447); /* sqrt(2) * (-c1-c3) */
    tmp1 = MULTIPLY(tmp1, FIX_2_053119869); /* sqrt(2) * ( c1+c3-c5+c7) */
    tmp2 = MULTIPLY(tmp2, FIX_3_072711026); /* sqrt(2) * ( c1+c3+c5-c7) */
    tmp1 += z1 + z3;
    tmp2 += z1 + z2;
    
    /* Final output stage: inputs are tmp10..tmp13, tmp0..tmp3 */
    
    wsptr[DCTSIZE*0] = (int) RIGHT_SHIFT(tmp10 + tmp3, CONST_BITS-PASS1_BITS);
    wsptr[DCTSIZE*7] = (int) RIGHT_SHIFT(tmp10 - tmp3, CONST_BITS-PASS1_BITS);
    wsptr[DCTSIZE*1] = (int) RIGHT_SHIFT(tmp11 + tmp2, CONST_BITS-PASS1_BITS);
    wsptr[DCTSIZE*6] = (int) RIGHT_SHIFT(tmp11 - tmp2, CONST_BITS-PASS1_BITS);
    wsptr[DCTSIZE*2] = (int) RIGHT_SHIFT(tmp12 + tmp1, CONST_BITS-PASS1_BITS);
    wsptr[DCTSIZE*5] = (int) RIGHT_SHIFT(tmp12 - tmp1, CONST_BITS-PASS1_BITS);
    wsptr[DCTSIZE*3] = (int) RIGHT_SHIFT(tmp13 + tmp0, CONST_BITS-PASS1_BITS);
    wsptr[DCTSIZE*4] = (int) RIGHT_SHIFT(tmp13 - tmp0, CONST_BITS-PASS1_BITS);
    
    inptr++;			/* advance pointers to next column */
    quantptr++;
    wsptr++;
  }

  /* Pass 2: process 8 rows from work array, store into output array.
   * 16-point IDCT kernel, cK represents sqrt(2) * cos(K*pi/32).
   */
  wsptr = workspace;
  for (ctr = 0; ctr < 8; ctr++) {
    outptr = output_buf[ctr] + output_col;

    /* Even part */

    /* Add fudge factor here for final descale. */
    tmp0 = (INT32) wsptr[0] + (ONE << (PASS1_BITS+2));
    tmp0 <<= CONST_BITS;

    z1 = (INT32) wsptr[4];
    tmp1 = MULTIPLY(z1, FIX(1.306562965));      /* c4[16] = c2[8] */
    tmp2 = MULTIPLY(z1, FIX_0_541196100);       /* c12[16] = c6[8] */

    tmp10 = tmp0 + tmp1;
    tmp11 = tmp0 - tmp1;
    tmp12 = tmp0 + tmp2;
    tmp13 = tmp0 - tmp2;

    z1 = (INT32) wsptr[2];
    z2 = (INT32) wsptr[6];
    z3 = z1 - z2;
    z4 = MULTIPLY(z3, FIX(0.275899379));        /* c14[16] = c7[8] */
    z3 = MULTIPLY(z3, FIX(1.387039845));        /* c2[16] = c1[8] */

    tmp0 = z3 + MULTIPLY(z2, FIX_2_562915447);  /* (c6+c2)[16] = (c3+c1)[8] */
    tmp1 = z4 + MULTIPLY(z1, FIX_0_899976223);  /* (c6-c14)[16] = (c3-c7)[8] */
    tmp2 = z3 - MULTIPLY(z1, FIX(0.601344887)); /* (c2-c10)[16] = (c1-c5)[8] */
    tmp3 = z4 - MULTIPLY(z2, FIX(0.509795579)); /* (c10-c14)[16] = (c5-c7)[8] */

    tmp20 = tmp10 + tmp0;
    tmp27 = tmp10 - tmp0;
    tmp21 = tmp12 + tmp1;
    tmp26 = tmp12 - tmp1;
    tmp22 = tmp13 + tmp2;
    tmp25 = tmp13 - tmp2;
    tmp23 = tmp11 + tmp3;
    tmp24 = tmp11 - tmp3;

    /* Odd part */

    z1 = (INT32) wsptr[1];
    z2 = (INT32) wsptr[3];
    z3 = (INT32) wsptr[5];
    z4 = (INT32) wsptr[7];

    tmp11 = z1 + z3;

    tmp1  = MULTIPLY(z1 + z2, FIX(1.353318001));   /* c3 */
    tmp2  = MULTIPLY(tmp11,   FIX(1.247225013));   /* c5 */
    tmp3  = MULTIPLY(z1 + z4, FIX(1.093201867));   /* c7 */
    tmp10 = MULTIPLY(z1 - z4, FIX(0.897167586));   /* c9 */
    tmp11 = MULTIPLY(tmp11,   FIX(0.666655658));   /* c11 */
    tmp12 = MULTIPLY(z1 - z2, FIX(0.410524528));   /* c13 */
    tmp0  = tmp1 + tmp2 + tmp3 -
	    MULTIPLY(z1, FIX(2.286341144));        /* c7+c5+c3-c1 */
    tmp13 = tmp10 + tmp11 + tmp12 -
	    MULTIPLY(z1, FIX(1.835730603));        /* c9+c11+c13-c15 */
    z1    = MULTIPLY(z2 + z3, FIX(0.138617169));   /* c15 */
    tmp1  += z1 + MULTIPLY(z2, FIX(0.071888074));  /* c9+c11-c3-c15 */
    tmp2  += z1 - MULTIPLY(z3, FIX(1.125726048));  /* c5+c7+c15-c3 */
    z1    = MULTIPLY(z3 - z2, FIX(1.407403738));   /* c1 */
    tmp11 += z1 - MULTIPLY(z3, FIX(0.766367282));  /* c1+c11-c9-c13 */
    tmp12 += z1 + MULTIPLY(z2, FIX(1.971951411));  /* c1+c5+c13-c7 */
    z2    += z4;
    z1    = MULTIPLY(z2, - FIX(0.666655658));      /* -c11 */
    tmp1  += z1;
    tmp3  += z1 + MULTIPLY(z4, FIX(1.065388962));  /* c3+c11+c15-c7 */
    z2    = MULTIPLY(z2, - FIX(1.247225013));      /* -c5 */
    tmp10 += z2 + MULTIPLY(z4, FIX(3.141271809));  /* c1+c5+c9-c13 */
    tmp12 += z2;
    z2    = MULTIPLY(z3 + z4, - FIX(1.353318001)); /* -c3 */
    tmp2  += z2;
    tmp3  += z2;
    z2    = MULTIPLY(z4 - z3, FIX(0.410524528));   /* c13 */
    tmp10 += z2;
    tmp11 += z2;

    /* Final output stage */

    outptr[0]  = range_limit[(int) RIGHT_SHIFT(tmp20 + tmp0,
					       CONST_BITS+PASS1_BITS+3)
			     & RANGE_MASK];
    outptr[15] = range_limit[(int) RIGHT_SHIFT(tmp20 - tmp0,
					       CONST_BITS+PASS1_BITS+3)
			     & RANGE_MASK];
    outptr[1]  = range_limit[(int) RIGHT_SHIFT(tmp21 + tmp1,
					       CONST_BITS+PASS1_BITS+3)
			     & RANGE_MASK];
    outptr[14] = range_limit[(int) RIGHT_SHIFT(tmp21 - tmp1,
					       CONST_BITS+PASS1_BITS+3)
			     & RANGE_MASK];
    outptr[2]  = range_limit[(int) RIGHT_SHIFT(tmp22 + tmp2,
					       CONST_BITS+PASS1_BITS+3)
			     & RANGE_MASK];
    outptr[13] = range_limit[(int) RIGHT_SHIFT(tmp22 - tmp2,
					       CONST_BITS+PASS1_BITS+3)
			     & RANGE_MASK];
    outptr[3]  = range_limit[(int) RIGHT_SHIFT(tmp23 + tmp3,
					       CONST_BITS+PASS1_BITS+3)
			     & RANGE_MASK];
    outptr[12] = range_limit[(int) RIGHT_SHIFT(tmp23 - tmp3,
					       CONST_BITS+PASS1_BITS+3)
			     & RANGE_MASK];
    outptr[4]  = range_limit[(int) RIGHT_SHIFT(tmp24 + tmp10,
					       CONST_BITS+PASS1_BITS+3)
			     & RANGE_MASK];
    outptr[11] = range_limit[(int) RIGHT_SHIFT(tmp24 - tmp10,
					       CONST_BITS+PASS1_BITS+3)
			     & RANGE_MASK];
    outptr[5]  = range_limit[(int) RIGHT_SHIFT(tmp25 + tmp11,
					       CONST_BITS+PASS1_BITS+3)
			     & RANGE_MASK];
    outptr[10] = range_limit[(int) RIGHT_SHIFT(tmp25 - tmp11,
					       CONST_BITS+PASS1_BITS+3)
			     & RANGE_MASK];
    outptr[6]  = range_limit[(int) RIGHT_SHIFT(tmp26 + tmp12,
					       CONST_BITS+PASS1_BITS+3)
			     & RANGE_MASK];
    outptr[9]  = range_limit[(int) RIGHT_SHIFT(tmp26 - tmp12,
					       CONST_BITS+PASS1_BITS+3)
			     & RANGE_MASK];
    outptr[7]  = range_limit[(int) RIGHT_SHIFT(tmp27 + tmp13,
					       CONST_BITS+PASS1_BITS+3)
			     & RANGE_MASK];
    outptr[8]  = range_limit[(int) RIGHT_SHIFT(tmp27 - tmp13,
					       CONST_BITS+PASS1_BITS+3)
			     & RANGE_MASK];

    wsptr += 8;		/* advance pointer to next row */
  }
}